

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI.cpp
# Opt level: O2

string * __thiscall A2::dump_abi_cxx11_(string *__return_storage_ptr__,A2 *this)

{
  pointer pbVar1;
  string *psVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  Type in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tag;
  pointer __lhs;
  string tags;
  string atts;
  string output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string *local_a0;
  A2 *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_a0 = __return_storage_ptr__;
  Lexer::typeToString_abi_cxx11_(&local_50,(Lexer *)(ulong)this->_lextype,in_EDX);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_98 = this;
  for (p_Var4 = (this->_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->_attributes)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    std::operator+(&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1)
                   ,"=\'\x1b[33m");
    std::operator+(&local_c0,&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 2)
                  );
    std::operator+(&local_90,&local_c0,"\x1b[0m\' ");
    std::__cxx11::string::append((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  pbVar1 = (local_98->_tags).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__lhs = (local_98->_tags).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __lhs != pbVar1; __lhs = __lhs + 1) {
    bVar3 = std::operator==(__lhs,"BINARY");
    if (bVar3) {
      std::operator+(&local_e0,"\x1b[1;37;44m",__lhs);
      std::operator+(&local_c0,&local_e0,"\x1b[0m ");
      std::__cxx11::string::append((string *)&local_90);
    }
    else {
      bVar3 = std::operator==(__lhs,"CMD");
      if (bVar3) {
        std::operator+(&local_e0,"\x1b[1;37;46m",__lhs);
        std::operator+(&local_c0,&local_e0,"\x1b[0m ");
        std::__cxx11::string::append((string *)&local_90);
      }
      else {
        bVar3 = std::operator==(__lhs,"EXT");
        if (bVar3) {
          std::operator+(&local_e0,"\x1b[1;37;42m",__lhs);
          std::operator+(&local_c0,&local_e0,"\x1b[0m ");
          std::__cxx11::string::append((string *)&local_90);
        }
        else {
          bVar3 = std::operator==(__lhs,"HINT");
          if (bVar3) {
            std::operator+(&local_e0,"\x1b[1;37;43m",__lhs);
            std::operator+(&local_c0,&local_e0,"\x1b[0m ");
            std::__cxx11::string::append((string *)&local_90);
          }
          else {
            bVar3 = std::operator==(__lhs,"FILTER");
            if (bVar3) {
              std::operator+(&local_e0,"\x1b[1;37;45m",__lhs);
              std::operator+(&local_c0,&local_e0,"\x1b[0m ");
              std::__cxx11::string::append((string *)&local_90);
            }
            else {
              bVar3 = std::operator==(__lhs,"CONFIG");
              if (bVar3) {
                std::operator+(&local_e0,"\x1b[1;37;101m",__lhs);
                std::operator+(&local_c0,&local_e0,"\x1b[0m ");
                std::__cxx11::string::append((string *)&local_90);
              }
              else {
                bVar3 = std::operator==(__lhs,"ID");
                if (bVar3) {
                  std::operator+(&local_e0,"\x1b[38;5;7m\x1b[48;5;34m",__lhs);
                  std::operator+(&local_c0,&local_e0,"\x1b[0m ");
                  std::__cxx11::string::append((string *)&local_90);
                }
                else {
                  std::operator+(&local_e0,"\x1b[32m",__lhs);
                  std::operator+(&local_c0,&local_e0,"\x1b[0m ");
                  std::__cxx11::string::append((string *)&local_90);
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  std::operator+(&local_e0,&local_50," ");
  std::operator+(&local_c0,&local_e0,&local_70);
  psVar2 = local_a0;
  std::operator+(local_a0,&local_c0,&local_90);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return psVar2;
}

Assistant:

std::string A2::dump () const
{
  auto output = Lexer::typeToString (_lextype);

  // Dump attributes.
  std::string atts;
  for (auto& a : _attributes)
    atts += a.first + "='\033[33m" + a.second + "\033[0m' ";

  // Dump tags.
  std::string tags;
  for (const auto& tag : _tags)
  {
         if (tag == "BINARY")        tags += "\033[1;37;44m"             + tag + "\033[0m ";
    else if (tag == "CMD")           tags += "\033[1;37;46m"             + tag + "\033[0m ";
    else if (tag == "EXT")           tags += "\033[1;37;42m"             + tag + "\033[0m ";
    else if (tag == "HINT")          tags += "\033[1;37;43m"             + tag + "\033[0m ";
    else if (tag == "FILTER")        tags += "\033[1;37;45m"             + tag + "\033[0m ";
    else if (tag == "CONFIG")        tags += "\033[1;37;101m"            + tag + "\033[0m ";
    else if (tag == "ID")            tags += "\033[38;5;7m\033[48;5;34m" + tag + "\033[0m ";
    else                             tags += "\033[32m"                  + tag + "\033[0m ";
  }

  return output + " " + atts + tags;
}